

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-create-socket-early.c
# Opt level: O1

int run_test_udp_create_early_bad_domain(void)

{
  int iVar1;
  undefined8 uVar2;
  long *plVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_udp_t client;
  long local_c8;
  undefined1 local_c0 [184];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_udp_init_ex(uVar2,local_c0,0x2f);
  local_c8 = (long)iVar1;
  if (local_c8 == -0x16) {
    uVar2 = uv_default_loop();
    iVar1 = uv_udp_init_ex(uVar2,local_c0,0x400);
    local_c8 = (long)iVar1;
    if (local_c8 == -0x16) {
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_c8 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (local_c8 == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001db93d;
    }
  }
  else {
    run_test_udp_create_early_bad_domain_cold_1();
  }
  run_test_udp_create_early_bad_domain_cold_2();
LAB_001db93d:
  plVar3 = &local_c8;
  run_test_udp_create_early_bad_domain_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_create_early_bad_domain) {
  uv_udp_t client;
  int r;

  r = uv_udp_init_ex(uv_default_loop(), &client, 47);
  ASSERT_EQ(r, UV_EINVAL);

  r = uv_udp_init_ex(uv_default_loop(), &client, 1024);
  ASSERT_EQ(r, UV_EINVAL);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}